

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Dequote(char *z)

{
  int j;
  int i;
  char quote;
  char *z_local;
  
  if ((z != (char *)0x0) && (quote = *z, (""[(byte)quote] & 0x80) != 0)) {
    if (quote == 0x5b) {
      quote = ']';
    }
    i = 1;
    j = 0;
    do {
      if (z[i] == quote) {
        if (z[i + 1] != quote) {
          z[j] = '\0';
          return;
        }
        z[j] = quote;
        i = i + 1;
      }
      else {
        z[j] = z[i];
      }
      j = j + 1;
      i = i + 1;
    } while( true );
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Dequote(char *z){
  char quote;
  int i, j;
  if( z==0 ) return;
  quote = z[0];
  if( !sqlite3Isquote(quote) ) return;
  if( quote=='[' ) quote = ']';
  for(i=1, j=0;; i++){
    assert( z[i] );
    if( z[i]==quote ){
      if( z[i+1]==quote ){
        z[j++] = quote;
        i++;
      }else{
        break;
      }
    }else{
      z[j++] = z[i];
    }
  }
  z[j] = 0;
}